

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QToolBarAreaLayoutItem>::reallocateAndGrow
          (QArrayDataPointer<QToolBarAreaLayoutItem> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QToolBarAreaLayoutItem> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QToolBarAreaLayoutItem> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QToolBarAreaLayoutItem> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff80;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80),
      bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QToolBarAreaLayoutItem> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QToolBarAreaLayoutItem> *)
                  operator->((QArrayDataPointer<QToolBarAreaLayoutItem> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6f791c);
        begin((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6f792b);
        QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QToolBarAreaLayoutItem *)
             operator->((QArrayDataPointer<QToolBarAreaLayoutItem> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6f7961);
        begin((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6f7970);
        QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::moveAppend
                  ((QPodArrayOps<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80,
                   (QToolBarAreaLayoutItem *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (QToolBarAreaLayoutItem *)0x6f798b);
      }
    }
    swap((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QToolBarAreaLayoutItem> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QToolBarAreaLayoutItem> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::reallocate
              ((QPodArrayOps<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }